

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::begin_object
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_visitor<wchar_t> *visitor,error_code *ec)

{
  int iVar1;
  iterator __position;
  ulong extraout_RAX;
  parse_state local_19;
  
  iVar1 = this->level_;
  this->level_ = iVar1 + 1;
  if ((iVar1 < this->max_nesting_depth_) ||
     (basic_json_parser<wchar_t,std::allocator<char>>::begin_object(), (extraout_RAX & 1) != 0)) {
    local_19 = object;
    __position._M_current =
         (this->state_stack_).
         super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->state_stack_).
        super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<jsoncons::parse_state,std::allocator<jsoncons::parse_state>>::
      _M_realloc_insert<jsoncons::parse_state_const&>
                ((vector<jsoncons::parse_state,std::allocator<jsoncons::parse_state>> *)
                 &this->state_stack_,__position,&local_19);
    }
    else {
      *__position._M_current = object;
      (this->state_stack_).
      super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->state_ = expect_member_name_or_end;
    (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this,ec);
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
  }
  return;
}

Assistant:

void begin_object(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++level_ > max_nesting_depth_))
        {
            more_ = err_handler_(json_errc::max_nesting_depth_exceeded, *this);
            if (!more_)
            {
                ec = json_errc::max_nesting_depth_exceeded;
                return;
            }
        } 

        push_state(parse_state::object);
        state_ = parse_state::expect_member_name_or_end;
        visitor.begin_object(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
    }